

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdapterState.hpp
# Opt level: O1

void __thiscall
linq::
ConcatState<linq::AdapterState<heavy_&,_std::vector<heavy,_std::allocator<heavy>_>_&>,_linq::IEnumerableCore<linq::AdapterState<heavy_&,_std::vector<heavy,_std::allocator<heavy>_>_&>_>,_heavy_&>
::Init(ConcatState<linq::AdapterState<heavy_&,_std::vector<heavy,_std::allocator<heavy>_>_&>,_linq::IEnumerableCore<linq::AdapterState<heavy_&,_std::vector<heavy,_std::allocator<heavy>_>_&>_>,_heavy_&>
       *this)

{
  vector<heavy,_std::allocator<heavy>_> *pvVar1;
  vector<heavy,_std::allocator<heavy>_> *pvVar2;
  pointer phVar3;
  pointer phVar4;
  
  pvVar1 = (this->source1).source;
  pvVar2 = (this->source2).source.source;
  phVar3 = (pvVar1->super__Vector_base<heavy,_std::allocator<heavy>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (this->source1).current._M_current = phVar3;
  phVar4 = (pvVar1->super__Vector_base<heavy,_std::allocator<heavy>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->source1).end._M_current = phVar4;
  (this->source2).source.current._M_current =
       (pvVar2->super__Vector_base<heavy,_std::allocator<heavy>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  (this->source2).source.end._M_current =
       (pvVar2->super__Vector_base<heavy,_std::allocator<heavy>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  this->s1 = phVar3 != phVar4;
  return;
}

Assistant:

void Init() override final
		{ 
			current = source.begin();
			end = source.end();
		}